

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall TEST_SimpleString_endsWith_Test::testBody(TEST_SimpleString_endsWith_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString str2;
  SimpleString str3;
  SimpleString str4;
  SimpleString str;
  SimpleString local_20;
  
  SimpleString::SimpleString(&str,"Hello World");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&str2,"World");
  bVar1 = SimpleString::endsWith(&str,&str2);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","str.endsWith(\"World\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a2,pTVar3);
  SimpleString::~SimpleString(&str2);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&str2,"Worl");
  bVar1 = SimpleString::endsWith(&str,&str2);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str.endsWith(\"Worl\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a3,pTVar3);
  SimpleString::~SimpleString(&str2);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&str2,"Hello");
  bVar1 = SimpleString::endsWith(&str,&str2);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str.endsWith(\"Hello\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a4,pTVar3);
  SimpleString::~SimpleString(&str2);
  SimpleString::SimpleString(&str2,"ah");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&str3,"ah");
  bVar1 = SimpleString::endsWith(&str2,&str3);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","str2.endsWith(\"ah\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a6,pTVar3);
  SimpleString::~SimpleString(&str3);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&str3,"baah");
  bVar1 = SimpleString::endsWith(&str2,&str3);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str2.endsWith(\"baah\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a7,pTVar3);
  SimpleString::~SimpleString(&str3);
  SimpleString::SimpleString(&str3,"");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&str4,"baah");
  bVar1 = SimpleString::endsWith(&str3,&str4);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!str3.endsWith(\"baah\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1a9,pTVar3);
  SimpleString::~SimpleString(&str4);
  SimpleString::SimpleString(&str4,"ha ha ha ha");
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_20,"ha");
  bVar1 = SimpleString::endsWith(&str4,&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","str4.endsWith(\"ha\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x1ac,pTVar3);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&str4);
  SimpleString::~SimpleString(&str3);
  SimpleString::~SimpleString(&str2);
  SimpleString::~SimpleString(&str);
  return;
}

Assistant:

TEST(SimpleString, endsWith)
{
    SimpleString str("Hello World");
    CHECK(str.endsWith("World"));
    CHECK(!str.endsWith("Worl"));
    CHECK(!str.endsWith("Hello"));
    SimpleString str2("ah");
    CHECK(str2.endsWith("ah"));
    CHECK(!str2.endsWith("baah"));
    SimpleString str3("");
    CHECK(!str3.endsWith("baah"));

    SimpleString str4("ha ha ha ha");
    CHECK(str4.endsWith("ha"));
}